

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_csharp.cpp
# Opt level: O3

void __thiscall
flatbuffers::csharp::CSharpGenerator::GenStruct_ObjectAPI
          (CSharpGenerator *this,StructDef *struct_def,string *code_ptr,IDLOptions *opts)

{
  SymbolTable<flatbuffers::Value> *this_00;
  Value *pVVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  BaseType BVar5;
  FieldDef *pFVar6;
  EnumDef *pEVar7;
  Type type;
  int iVar8;
  const_iterator cVar9;
  long *plVar10;
  undefined8 *puVar11;
  pointer ppFVar12;
  size_type *psVar13;
  ulong *puVar14;
  long *plVar15;
  pointer ppFVar16;
  undefined8 uVar17;
  _Alloc_hider _Var18;
  bool bVar19;
  string utype_name;
  string camel_name;
  string type_name;
  string class_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  string local_160;
  string local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  CSharpGenerator *local_c0;
  key_type local_b8;
  IDLOptions *local_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  BaseType local_70;
  undefined4 uStack_6c;
  StructDef *pSStack_68;
  EnumDef *local_60;
  uint16_t uStack_58;
  undefined6 uStack_56;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  local_c0 = this;
  local_98 = opts;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"private","");
  this_00 = &(struct_def->super_Definition).attributes;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
  ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
          *)this_00,&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)code_ptr);
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"csharp_partial","");
  cVar9 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                  *)this_00,&local_b8);
  if ((_Rb_tree_header *)cVar9._M_node ==
      &(struct_def->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header) {
    bVar19 = true;
  }
  else {
    bVar19 = *(long *)(cVar9._M_node + 2) == 0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if (!bVar19) {
    std::__cxx11::string::append((char *)code_ptr);
  }
  GenTypeName_ObjectAPI(&local_b8,local_c0,(string *)struct_def,local_98);
  std::operator+(&local_100,"class ",&local_b8);
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_100._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)code_ptr);
  ppFVar16 = (struct_def->fields).vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppFVar12 = (struct_def->fields).vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  if (ppFVar16 != ppFVar12) {
    do {
      pFVar6 = *ppFVar16;
      if (((pFVar6->deprecated == false) && ((pFVar6->value).type.base_type != BASE_TYPE_UTYPE)) &&
         ((pFVar6->value).type.element != BASE_TYPE_UTYPE)) {
        pVVar1 = &pFVar6->value;
        GenTypeGet_ObjectAPI_abi_cxx11_(&local_100,local_c0,pVVar1->type,local_98);
        if (((pFVar6->value).type.base_type - BASE_TYPE_UTYPE < 0xc) &&
           (pFVar6->presence == kOptional)) {
          std::__cxx11::string::append((char *)&local_100);
        }
        Name_abi_cxx11_(&local_140,local_c0,pFVar6);
        if ((local_140._M_string_length == (struct_def->super_Definition).name._M_string_length) &&
           ((local_140._M_string_length == 0 ||
            (iVar8 = bcmp(local_140._M_dataplus._M_p,
                          (struct_def->super_Definition).name._M_dataplus._M_p,
                          local_140._M_string_length), iVar8 == 0)))) {
          std::__cxx11::string::append((char *)&local_140);
        }
        if (local_98->cs_gen_json_serializer == true) {
          pEVar7 = (pFVar6->value).type.enum_def;
          if ((pEVar7 != (EnumDef *)0x0) && (pEVar7->is_union == true)) {
            NamespacedName_abi_cxx11_(&local_160,local_c0,&pEVar7->super_Definition);
            std::operator+(&local_180,"  [Newtonsoft.Json.JsonProperty(\"",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           pFVar6);
            plVar10 = (long *)std::__cxx11::string::append((char *)&local_180);
            local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
            psVar13 = (size_type *)(plVar10 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar13) {
              local_1a0.field_2._M_allocated_capacity = *psVar13;
              local_1a0.field_2._8_8_ = plVar10[3];
            }
            else {
              local_1a0.field_2._M_allocated_capacity = *psVar13;
              local_1a0._M_dataplus._M_p = (pointer)*plVar10;
            }
            local_1a0._M_string_length = plVar10[1];
            *plVar10 = (long)psVar13;
            plVar10[1] = 0;
            *(undefined1 *)(plVar10 + 2) = 0;
            std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_1a0._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
              operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_180._M_dataplus._M_p != &local_180.field_2) {
              operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1
                             );
            }
            BVar5 = (pVVar1->type).base_type;
            if ((BVar5 == BASE_TYPE_VECTOR64) || (BVar5 == BASE_TYPE_VECTOR)) {
              std::operator+(&local_e0,"  private ",&local_160);
              plVar10 = (long *)std::__cxx11::string::append((char *)&local_e0);
              local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
              psVar13 = (size_type *)(plVar10 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar10 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar13) {
                local_120.field_2._M_allocated_capacity = *psVar13;
                local_120.field_2._8_8_ = plVar10[3];
              }
              else {
                local_120.field_2._M_allocated_capacity = *psVar13;
                local_120._M_dataplus._M_p = (pointer)*plVar10;
              }
              local_120._M_string_length = plVar10[1];
              *plVar10 = (long)psVar13;
              plVar10[1] = 0;
              *(undefined1 *)(plVar10 + 2) = 0;
              plVar10 = (long *)std::__cxx11::string::_M_append
                                          ((char *)&local_120,(ulong)local_140._M_dataplus._M_p);
              local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
              psVar13 = (size_type *)(plVar10 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar10 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar13) {
                local_180.field_2._M_allocated_capacity = *psVar13;
                local_180.field_2._8_8_ = plVar10[3];
              }
              else {
                local_180.field_2._M_allocated_capacity = *psVar13;
                local_180._M_dataplus._M_p = (pointer)*plVar10;
              }
              local_180._M_string_length = plVar10[1];
              *plVar10 = (long)psVar13;
              plVar10[1] = 0;
              *(undefined1 *)(plVar10 + 2) = 0;
              plVar10 = (long *)std::__cxx11::string::append((char *)&local_180);
              local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
              psVar13 = (size_type *)(plVar10 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar10 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar13) {
                local_1a0.field_2._M_allocated_capacity = *psVar13;
                local_1a0.field_2._8_8_ = plVar10[3];
              }
              else {
                local_1a0.field_2._M_allocated_capacity = *psVar13;
                local_1a0._M_dataplus._M_p = (pointer)*plVar10;
              }
              local_1a0._M_string_length = plVar10[1];
              *plVar10 = (long)psVar13;
              plVar10[1] = 0;
              *(undefined1 *)(plVar10 + 2) = 0;
              std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_1a0._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
                operator_delete(local_1a0._M_dataplus._M_p,
                                local_1a0.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_180._M_dataplus._M_p != &local_180.field_2) {
                operator_delete(local_180._M_dataplus._M_p,
                                local_180.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_120._M_dataplus._M_p != &local_120.field_2) {
                operator_delete(local_120._M_dataplus._M_p,
                                local_120.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
                operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1
                               );
              }
              std::__cxx11::string::append((char *)code_ptr);
              std::operator+(&local_180,"      if (this.",&local_140);
              plVar10 = (long *)std::__cxx11::string::append((char *)&local_180);
              local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
              psVar13 = (size_type *)(plVar10 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar10 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar13) {
                local_1a0.field_2._M_allocated_capacity = *psVar13;
                local_1a0.field_2._8_8_ = plVar10[3];
              }
              else {
                local_1a0.field_2._M_allocated_capacity = *psVar13;
                local_1a0._M_dataplus._M_p = (pointer)*plVar10;
              }
              local_1a0._M_string_length = plVar10[1];
              *plVar10 = (long)psVar13;
              plVar10[1] = 0;
              *(undefined1 *)(plVar10 + 2) = 0;
              std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_1a0._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
                operator_delete(local_1a0._M_dataplus._M_p,
                                local_1a0.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_180._M_dataplus._M_p != &local_180.field_2) {
                operator_delete(local_180._M_dataplus._M_p,
                                local_180.field_2._M_allocated_capacity + 1);
              }
              std::operator+(&local_e0,"      var _o = new ",&local_160);
              plVar10 = (long *)std::__cxx11::string::append((char *)&local_e0);
              local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
              psVar13 = (size_type *)(plVar10 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar10 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar13) {
                local_120.field_2._M_allocated_capacity = *psVar13;
                local_120.field_2._8_8_ = plVar10[3];
              }
              else {
                local_120.field_2._M_allocated_capacity = *psVar13;
                local_120._M_dataplus._M_p = (pointer)*plVar10;
              }
              local_120._M_string_length = plVar10[1];
              *plVar10 = (long)psVar13;
              plVar10[1] = 0;
              *(undefined1 *)(plVar10 + 2) = 0;
              plVar10 = (long *)std::__cxx11::string::_M_append
                                          ((char *)&local_120,(ulong)local_140._M_dataplus._M_p);
              local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
              psVar13 = (size_type *)(plVar10 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar10 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar13) {
                local_180.field_2._M_allocated_capacity = *psVar13;
                local_180.field_2._8_8_ = plVar10[3];
              }
              else {
                local_180.field_2._M_allocated_capacity = *psVar13;
                local_180._M_dataplus._M_p = (pointer)*plVar10;
              }
              local_180._M_string_length = plVar10[1];
              *plVar10 = (long)psVar13;
              plVar10[1] = 0;
              *(undefined1 *)(plVar10 + 2) = 0;
              plVar10 = (long *)std::__cxx11::string::append((char *)&local_180);
              local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
              psVar13 = (size_type *)(plVar10 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar10 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar13) {
                local_1a0.field_2._M_allocated_capacity = *psVar13;
                local_1a0.field_2._8_8_ = plVar10[3];
              }
              else {
                local_1a0.field_2._M_allocated_capacity = *psVar13;
                local_1a0._M_dataplus._M_p = (pointer)*plVar10;
              }
              local_1a0._M_string_length = plVar10[1];
              *plVar10 = (long)psVar13;
              plVar10[1] = 0;
              *(undefined1 *)(plVar10 + 2) = 0;
              std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_1a0._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
                operator_delete(local_1a0._M_dataplus._M_p,
                                local_1a0.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_180._M_dataplus._M_p != &local_180.field_2) {
                operator_delete(local_180._M_dataplus._M_p,
                                local_180.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_120._M_dataplus._M_p != &local_120.field_2) {
                operator_delete(local_120._M_dataplus._M_p,
                                local_120.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
                operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1
                               );
              }
              std::operator+(&local_180,
                             "      for (var _j = 0; _j < _o.Length; ++_j) { _o[_j] = this.",
                             &local_140);
              plVar10 = (long *)std::__cxx11::string::append((char *)&local_180);
              local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
              psVar13 = (size_type *)(plVar10 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar10 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar13) {
                local_1a0.field_2._M_allocated_capacity = *psVar13;
                local_1a0.field_2._8_8_ = plVar10[3];
              }
              else {
                local_1a0.field_2._M_allocated_capacity = *psVar13;
                local_1a0._M_dataplus._M_p = (pointer)*plVar10;
              }
              local_1a0._M_string_length = plVar10[1];
              *plVar10 = (long)psVar13;
              plVar10[1] = 0;
              *(undefined1 *)(plVar10 + 2) = 0;
              std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_1a0._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
                operator_delete(local_1a0._M_dataplus._M_p,
                                local_1a0.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_180._M_dataplus._M_p != &local_180.field_2) {
                operator_delete(local_180._M_dataplus._M_p,
                                local_180.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::string::append((char *)code_ptr);
              std::__cxx11::string::append((char *)code_ptr);
              std::__cxx11::string::append((char *)code_ptr);
              std::operator+(&local_e0,"      this.",&local_140);
              puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_e0);
              local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
              psVar13 = puVar11 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar11 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar13) {
                local_120.field_2._M_allocated_capacity = *psVar13;
                local_120.field_2._8_8_ = puVar11[3];
              }
              else {
                local_120.field_2._M_allocated_capacity = *psVar13;
                local_120._M_dataplus._M_p = (pointer)*puVar11;
              }
              local_120._M_string_length = puVar11[1];
              *puVar11 = psVar13;
              puVar11[1] = 0;
              *(undefined1 *)(puVar11 + 2) = 0;
              plVar10 = (long *)std::__cxx11::string::_M_append
                                          ((char *)&local_120,(ulong)local_160._M_dataplus._M_p);
              local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
              puVar14 = (ulong *)(plVar10 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar10 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar14) {
                local_180.field_2._M_allocated_capacity = *puVar14;
                local_180.field_2._8_8_ = plVar10[3];
              }
              else {
                local_180.field_2._M_allocated_capacity = *puVar14;
                local_180._M_dataplus._M_p = (pointer)*plVar10;
              }
              local_180._M_string_length = plVar10[1];
              *plVar10 = (long)puVar14;
              plVar10[1] = 0;
              *(undefined1 *)(plVar10 + 2) = 0;
              plVar10 = (long *)std::__cxx11::string::append((char *)&local_180);
              local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
              psVar13 = (size_type *)(plVar10 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar10 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar13) {
                local_1a0.field_2._M_allocated_capacity = *psVar13;
                local_1a0.field_2._8_8_ = plVar10[3];
              }
              else {
                local_1a0.field_2._M_allocated_capacity = *psVar13;
                local_1a0._M_dataplus._M_p = (pointer)*plVar10;
              }
              local_1a0._M_string_length = plVar10[1];
              *plVar10 = (long)psVar13;
              plVar10[1] = 0;
              *(undefined1 *)(plVar10 + 2) = 0;
              std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_1a0._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
                operator_delete(local_1a0._M_dataplus._M_p,
                                local_1a0.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_180._M_dataplus._M_p != &local_180.field_2) {
                operator_delete(local_180._M_dataplus._M_p,
                                local_180.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_120._M_dataplus._M_p != &local_120.field_2) {
                operator_delete(local_120._M_dataplus._M_p,
                                local_120.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
                operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1
                               );
              }
              std::__cxx11::string::append((char *)code_ptr);
              std::operator+(&local_180,"        var _o = new ",&local_160);
              plVar10 = (long *)std::__cxx11::string::append((char *)&local_180);
              local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
              psVar13 = (size_type *)(plVar10 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar10 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar13) {
                local_1a0.field_2._M_allocated_capacity = *psVar13;
                local_1a0.field_2._8_8_ = plVar10[3];
              }
              else {
                local_1a0.field_2._M_allocated_capacity = *psVar13;
                local_1a0._M_dataplus._M_p = (pointer)*plVar10;
              }
              local_1a0._M_string_length = plVar10[1];
              *plVar10 = (long)psVar13;
              plVar10[1] = 0;
              *(undefined1 *)(plVar10 + 2) = 0;
              std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_1a0._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
                operator_delete(local_1a0._M_dataplus._M_p,
                                local_1a0.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_180._M_dataplus._M_p != &local_180.field_2) {
                operator_delete(local_180._M_dataplus._M_p,
                                local_180.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::string::append((char *)code_ptr);
              std::operator+(&local_180,"        this.",&local_140);
              puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_180);
              local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
              psVar13 = puVar11 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar11 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar13) {
                local_1a0.field_2._M_allocated_capacity = *psVar13;
                local_1a0.field_2._8_8_ = puVar11[3];
              }
              else {
                local_1a0.field_2._M_allocated_capacity = *psVar13;
                local_1a0._M_dataplus._M_p = (pointer)*puVar11;
              }
              local_1a0._M_string_length = puVar11[1];
              *puVar11 = psVar13;
              puVar11[1] = 0;
              *(undefined1 *)(puVar11 + 2) = 0;
              std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_1a0._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
                operator_delete(local_1a0._M_dataplus._M_p,
                                local_1a0.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_180._M_dataplus._M_p != &local_180.field_2) {
                operator_delete(local_180._M_dataplus._M_p,
                                local_180.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::string::append((char *)code_ptr);
            }
            else {
              std::operator+(&local_e0,"  private ",&local_160);
              plVar10 = (long *)std::__cxx11::string::append((char *)&local_e0);
              local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
              psVar13 = (size_type *)(plVar10 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar10 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar13) {
                local_120.field_2._M_allocated_capacity = *psVar13;
                local_120.field_2._8_8_ = plVar10[3];
              }
              else {
                local_120.field_2._M_allocated_capacity = *psVar13;
                local_120._M_dataplus._M_p = (pointer)*plVar10;
              }
              local_120._M_string_length = plVar10[1];
              *plVar10 = (long)psVar13;
              plVar10[1] = 0;
              *(undefined1 *)(plVar10 + 2) = 0;
              plVar10 = (long *)std::__cxx11::string::_M_append
                                          ((char *)&local_120,(ulong)local_140._M_dataplus._M_p);
              local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
              psVar13 = (size_type *)(plVar10 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar10 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar13) {
                local_180.field_2._M_allocated_capacity = *psVar13;
                local_180.field_2._8_8_ = plVar10[3];
              }
              else {
                local_180.field_2._M_allocated_capacity = *psVar13;
                local_180._M_dataplus._M_p = (pointer)*plVar10;
              }
              local_180._M_string_length = plVar10[1];
              *plVar10 = (long)psVar13;
              plVar10[1] = 0;
              *(undefined1 *)(plVar10 + 2) = 0;
              plVar10 = (long *)std::__cxx11::string::append((char *)&local_180);
              local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
              psVar13 = (size_type *)(plVar10 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar10 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar13) {
                local_1a0.field_2._M_allocated_capacity = *psVar13;
                local_1a0.field_2._8_8_ = plVar10[3];
              }
              else {
                local_1a0.field_2._M_allocated_capacity = *psVar13;
                local_1a0._M_dataplus._M_p = (pointer)*plVar10;
              }
              local_1a0._M_string_length = plVar10[1];
              *plVar10 = (long)psVar13;
              plVar10[1] = 0;
              *(undefined1 *)(plVar10 + 2) = 0;
              std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_1a0._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
                operator_delete(local_1a0._M_dataplus._M_p,
                                local_1a0.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_180._M_dataplus._M_p != &local_180.field_2) {
                operator_delete(local_180._M_dataplus._M_p,
                                local_180.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_120._M_dataplus._M_p != &local_120.field_2) {
                operator_delete(local_120._M_dataplus._M_p,
                                local_120.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
                operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1
                               );
              }
              std::__cxx11::string::append((char *)code_ptr);
              std::operator+(&local_50,"      return this.",&local_140);
              plVar10 = (long *)std::__cxx11::string::append((char *)&local_50);
              local_90 = &local_80;
              plVar15 = plVar10 + 2;
              if ((long *)*plVar10 == plVar15) {
                local_80 = *plVar15;
                lStack_78 = plVar10[3];
              }
              else {
                local_80 = *plVar15;
                local_90 = (long *)*plVar10;
              }
              local_88 = plVar10[1];
              *plVar10 = (long)plVar15;
              plVar10[1] = 0;
              *(undefined1 *)(plVar10 + 2) = 0;
              plVar10 = (long *)std::__cxx11::string::_M_append
                                          ((char *)&local_90,(ulong)local_140._M_dataplus._M_p);
              local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
              puVar14 = (ulong *)(plVar10 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar10 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar14) {
                local_e0.field_2._M_allocated_capacity = *puVar14;
                local_e0.field_2._8_8_ = plVar10[3];
              }
              else {
                local_e0.field_2._M_allocated_capacity = *puVar14;
                local_e0._M_dataplus._M_p = (pointer)*plVar10;
              }
              local_e0._M_string_length = plVar10[1];
              *plVar10 = (long)puVar14;
              plVar10[1] = 0;
              *(undefined1 *)(plVar10 + 2) = 0;
              plVar10 = (long *)std::__cxx11::string::append((char *)&local_e0);
              local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
              psVar13 = (size_type *)(plVar10 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar10 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar13) {
                local_120.field_2._M_allocated_capacity = *psVar13;
                local_120.field_2._8_8_ = plVar10[3];
              }
              else {
                local_120.field_2._M_allocated_capacity = *psVar13;
                local_120._M_dataplus._M_p = (pointer)*plVar10;
              }
              local_120._M_string_length = plVar10[1];
              *plVar10 = (long)psVar13;
              plVar10[1] = 0;
              *(undefined1 *)(plVar10 + 2) = 0;
              plVar10 = (long *)std::__cxx11::string::_M_append
                                          ((char *)&local_120,(ulong)local_160._M_dataplus._M_p);
              local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
              psVar13 = (size_type *)(plVar10 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar10 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar13) {
                local_180.field_2._M_allocated_capacity = *psVar13;
                local_180.field_2._8_8_ = plVar10[3];
              }
              else {
                local_180.field_2._M_allocated_capacity = *psVar13;
                local_180._M_dataplus._M_p = (pointer)*plVar10;
              }
              local_180._M_string_length = plVar10[1];
              *plVar10 = (long)psVar13;
              plVar10[1] = 0;
              *(undefined1 *)(plVar10 + 2) = 0;
              plVar10 = (long *)std::__cxx11::string::append((char *)&local_180);
              local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
              psVar13 = (size_type *)(plVar10 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar10 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar13) {
                local_1a0.field_2._M_allocated_capacity = *psVar13;
                local_1a0.field_2._8_8_ = plVar10[3];
              }
              else {
                local_1a0.field_2._M_allocated_capacity = *psVar13;
                local_1a0._M_dataplus._M_p = (pointer)*plVar10;
              }
              local_1a0._M_string_length = plVar10[1];
              *plVar10 = (long)psVar13;
              plVar10[1] = 0;
              *(undefined1 *)(plVar10 + 2) = 0;
              std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_1a0._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
                operator_delete(local_1a0._M_dataplus._M_p,
                                local_1a0.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_180._M_dataplus._M_p != &local_180.field_2) {
                operator_delete(local_180._M_dataplus._M_p,
                                local_180.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_120._M_dataplus._M_p != &local_120.field_2) {
                operator_delete(local_120._M_dataplus._M_p,
                                local_120.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
                operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1
                               );
              }
              if (local_90 != &local_80) {
                operator_delete(local_90,local_80 + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_50._M_dataplus._M_p != &local_50.field_2) {
                operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1
                               );
              }
              std::__cxx11::string::append((char *)code_ptr);
              std::__cxx11::string::append((char *)code_ptr);
              std::operator+(&local_e0,"      this.",&local_140);
              puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_e0);
              local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
              psVar13 = puVar11 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar11 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar13) {
                local_120.field_2._M_allocated_capacity = *psVar13;
                local_120.field_2._8_8_ = puVar11[3];
              }
              else {
                local_120.field_2._M_allocated_capacity = *psVar13;
                local_120._M_dataplus._M_p = (pointer)*puVar11;
              }
              local_120._M_string_length = puVar11[1];
              *puVar11 = psVar13;
              puVar11[1] = 0;
              *(undefined1 *)(puVar11 + 2) = 0;
              plVar10 = (long *)std::__cxx11::string::_M_append
                                          ((char *)&local_120,(ulong)local_160._M_dataplus._M_p);
              local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
              puVar14 = (ulong *)(plVar10 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar10 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar14) {
                local_180.field_2._M_allocated_capacity = *puVar14;
                local_180.field_2._8_8_ = plVar10[3];
              }
              else {
                local_180.field_2._M_allocated_capacity = *puVar14;
                local_180._M_dataplus._M_p = (pointer)*plVar10;
              }
              local_180._M_string_length = plVar10[1];
              *plVar10 = (long)puVar14;
              plVar10[1] = 0;
              *(undefined1 *)(plVar10 + 2) = 0;
              plVar10 = (long *)std::__cxx11::string::append((char *)&local_180);
              local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
              psVar13 = (size_type *)(plVar10 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar10 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar13) {
                local_1a0.field_2._M_allocated_capacity = *psVar13;
                local_1a0.field_2._8_8_ = plVar10[3];
              }
              else {
                local_1a0.field_2._M_allocated_capacity = *psVar13;
                local_1a0._M_dataplus._M_p = (pointer)*plVar10;
              }
              local_1a0._M_string_length = plVar10[1];
              *plVar10 = (long)psVar13;
              plVar10[1] = 0;
              *(undefined1 *)(plVar10 + 2) = 0;
              std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_1a0._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
                operator_delete(local_1a0._M_dataplus._M_p,
                                local_1a0.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_180._M_dataplus._M_p != &local_180.field_2) {
                operator_delete(local_180._M_dataplus._M_p,
                                local_180.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_120._M_dataplus._M_p != &local_120.field_2) {
                operator_delete(local_120._M_dataplus._M_p,
                                local_120.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
                operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1
                               );
              }
              std::operator+(&local_180,"      this.",&local_140);
              puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_180);
              local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
              psVar13 = puVar11 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar11 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar13) {
                local_1a0.field_2._M_allocated_capacity = *psVar13;
                local_1a0.field_2._8_8_ = puVar11[3];
              }
              else {
                local_1a0.field_2._M_allocated_capacity = *psVar13;
                local_1a0._M_dataplus._M_p = (pointer)*puVar11;
              }
              local_1a0._M_string_length = puVar11[1];
              *puVar11 = psVar13;
              puVar11[1] = 0;
              *(undefined1 *)(puVar11 + 2) = 0;
              std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_1a0._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
                operator_delete(local_1a0._M_dataplus._M_p,
                                local_1a0.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_180._M_dataplus._M_p != &local_180.field_2) {
                operator_delete(local_180._M_dataplus._M_p,
                                local_180.field_2._M_allocated_capacity + 1);
              }
            }
            std::__cxx11::string::append((char *)code_ptr);
            std::__cxx11::string::append((char *)code_ptr);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_160._M_dataplus._M_p != &local_160.field_2) {
              operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1
                             );
            }
          }
          std::operator+(&local_1a0,"  [Newtonsoft.Json.JsonProperty(\"",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pFVar6
                        );
          plVar10 = (long *)std::__cxx11::string::append((char *)&local_1a0);
          local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
          psVar13 = (size_type *)(plVar10 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar13) {
            local_160.field_2._M_allocated_capacity = *psVar13;
            local_160.field_2._8_8_ = plVar10[3];
          }
          else {
            local_160.field_2._M_allocated_capacity = *psVar13;
            local_160._M_dataplus._M_p = (pointer)*plVar10;
          }
          local_160._M_string_length = plVar10[1];
          *plVar10 = (long)psVar13;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_160._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_160._M_dataplus._M_p != &local_160.field_2) {
            operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
            operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
          }
          pEVar7 = (pFVar6->value).type.enum_def;
          if ((pEVar7 != (EnumDef *)0x0) && (pEVar7->is_union == true)) {
            BVar5 = (pVVar1->type).base_type;
            if ((BVar5 == BASE_TYPE_VECTOR64) || (BVar5 == BASE_TYPE_VECTOR)) {
              local_70 = (pFVar6->value).type.element;
              pSStack_68 = (pFVar6->value).type.struct_def;
              uStack_58 = (pFVar6->value).type.fixed_length;
              uStack_6c = 0;
              type.element = BASE_TYPE_NONE;
              type.base_type = local_70;
              type._26_6_ = uStack_56;
              type.fixed_length = uStack_58;
              type.struct_def = pSStack_68;
              type.enum_def = pEVar7;
              local_60 = pEVar7;
              GenTypeGet_ObjectAPI_abi_cxx11_(&local_160,local_c0,type,local_98);
            }
            else {
              local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_160,local_100._M_dataplus._M_p,
                         local_100._M_dataplus._M_p + local_100._M_string_length);
            }
            std::operator+(&local_180,"  [Newtonsoft.Json.JsonConverter(typeof(",&local_160);
            puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_180);
            local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
            psVar13 = puVar11 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar11 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar13) {
              local_1a0.field_2._M_allocated_capacity = *psVar13;
              local_1a0.field_2._8_8_ = puVar11[3];
            }
            else {
              local_1a0.field_2._M_allocated_capacity = *psVar13;
              local_1a0._M_dataplus._M_p = (pointer)*puVar11;
            }
            local_1a0._M_string_length = puVar11[1];
            *puVar11 = psVar13;
            puVar11[1] = 0;
            *(undefined1 *)(puVar11 + 2) = 0;
            std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_1a0._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
              operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_180._M_dataplus._M_p != &local_180.field_2) {
              operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_160._M_dataplus._M_p != &local_160.field_2) {
              operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1
                             );
            }
          }
          local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"hash","");
          cVar9 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                  ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                          *)&(pFVar6->super_Definition).attributes,&local_160);
          if ((_Rb_tree_header *)cVar9._M_node ==
              &(pFVar6->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header) {
            bVar19 = true;
          }
          else {
            bVar19 = *(long *)(cVar9._M_node + 2) == 0;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_160._M_dataplus._M_p != &local_160.field_2) {
            operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
          }
          if (!bVar19) {
            std::__cxx11::string::append((char *)code_ptr);
          }
        }
        std::operator+(&local_120,"  public ",&local_100);
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_120);
        local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
        puVar14 = (ulong *)(plVar10 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar14) {
          local_180.field_2._M_allocated_capacity = *puVar14;
          local_180.field_2._8_8_ = plVar10[3];
        }
        else {
          local_180.field_2._M_allocated_capacity = *puVar14;
          local_180._M_dataplus._M_p = (pointer)*plVar10;
        }
        local_180._M_string_length = plVar10[1];
        *plVar10 = (long)puVar14;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        puVar11 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_180,(ulong)local_140._M_dataplus._M_p);
        local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
        psVar13 = puVar11 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar13) {
          local_1a0.field_2._M_allocated_capacity = *psVar13;
          local_1a0.field_2._8_8_ = puVar11[3];
        }
        else {
          local_1a0.field_2._M_allocated_capacity = *psVar13;
          local_1a0._M_dataplus._M_p = (pointer)*puVar11;
        }
        local_1a0._M_string_length = puVar11[1];
        *puVar11 = psVar13;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_1a0);
        local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
        psVar13 = (size_type *)(plVar10 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar13) {
          local_160.field_2._M_allocated_capacity = *psVar13;
          local_160.field_2._8_8_ = plVar10[3];
        }
        else {
          local_160.field_2._M_allocated_capacity = *psVar13;
          local_160._M_dataplus._M_p = (pointer)*plVar10;
        }
        local_160._M_string_length = plVar10[1];
        *plVar10 = (long)psVar13;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_160._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_160._M_dataplus._M_p != &local_160.field_2) {
          operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
          operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_180._M_dataplus._M_p != &local_180.field_2) {
          operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120._M_dataplus._M_p != &local_120.field_2) {
          operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_140._M_dataplus._M_p != &local_140.field_2) {
          operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._M_dataplus._M_p != &local_100.field_2) {
          operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
        }
        ppFVar12 = (struct_def->fields).vec.
                   super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
      }
      ppFVar16 = ppFVar16 + 1;
    } while (ppFVar16 != ppFVar12);
  }
  std::__cxx11::string::append((char *)code_ptr);
  std::operator+(&local_140,"  public ",&local_b8);
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_140);
  psVar13 = (size_type *)(plVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    local_100.field_2._M_allocated_capacity = *psVar13;
    local_100.field_2._8_8_ = plVar10[3];
    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  }
  else {
    local_100.field_2._M_allocated_capacity = *psVar13;
    local_100._M_dataplus._M_p = (pointer)*plVar10;
  }
  local_100._M_string_length = plVar10[1];
  *plVar10 = (long)psVar13;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_100._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
  }
  ppFVar16 = (struct_def->fields).vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppFVar12 = (struct_def->fields).vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  if (ppFVar16 != ppFVar12) {
    paVar2 = &local_160.field_2;
    do {
      pFVar6 = *ppFVar16;
      if (((pFVar6->deprecated == false) && ((pFVar6->value).type.base_type != BASE_TYPE_UTYPE)) &&
         ((pFVar6->value).type.element != BASE_TYPE_UTYPE)) {
        Name_abi_cxx11_(&local_100,local_c0,pFVar6);
        if ((local_100._M_string_length == (struct_def->super_Definition).name._M_string_length) &&
           ((local_100._M_string_length == 0 ||
            (iVar8 = bcmp(local_100._M_dataplus._M_p,
                          (struct_def->super_Definition).name._M_dataplus._M_p,
                          local_100._M_string_length), iVar8 == 0)))) {
          std::__cxx11::string::append((char *)&local_100);
        }
        std::operator+(&local_160,"    this.",&local_100);
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_160);
        local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
        psVar13 = (size_type *)(plVar10 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar13) {
          local_140.field_2._M_allocated_capacity = *psVar13;
          local_140.field_2._8_8_ = plVar10[3];
        }
        else {
          local_140.field_2._M_allocated_capacity = *psVar13;
          local_140._M_dataplus._M_p = (pointer)*plVar10;
        }
        local_140._M_string_length = plVar10[1];
        *plVar10 = (long)psVar13;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_140._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_140._M_dataplus._M_p != &local_140.field_2) {
          operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_160._M_dataplus._M_p != paVar2) {
          operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
        }
        GenTypeGet_ObjectAPI_abi_cxx11_(&local_140,local_c0,(pFVar6->value).type,local_98);
        BVar5 = (pFVar6->value).type.base_type;
        if (BVar5 - BASE_TYPE_UTYPE < 0xc) {
          GenDefaultValue_abi_cxx11_(&local_1a0,local_c0,pFVar6,true);
          plVar10 = (long *)std::__cxx11::string::append((char *)&local_1a0);
          psVar13 = (size_type *)(plVar10 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar13) {
            local_160.field_2._M_allocated_capacity = *psVar13;
            local_160.field_2._8_8_ = plVar10[3];
            local_160._M_dataplus._M_p = (pointer)paVar2;
          }
          else {
            local_160.field_2._M_allocated_capacity = *psVar13;
            local_160._M_dataplus._M_p = (pointer)*plVar10;
          }
          local_160._M_string_length = plVar10[1];
          *plVar10 = (long)psVar13;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_160._M_dataplus._M_p);
LAB_001bd421:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_160._M_dataplus._M_p != paVar2) {
            operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
          }
          uVar17 = local_1a0.field_2._M_allocated_capacity;
          _Var18._M_p = local_1a0._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
LAB_001bd6a0:
            operator_delete(_Var18._M_p,uVar17 + 1);
          }
        }
        else {
          if (BVar5 != BASE_TYPE_ARRAY) {
            if ((BVar5 == BASE_TYPE_STRUCT) && (((pFVar6->value).type.struct_def)->fixed == true)) {
              std::operator+(&local_1a0,"new ",&local_140);
              plVar10 = (long *)std::__cxx11::string::append((char *)&local_1a0);
              psVar13 = (size_type *)(plVar10 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar10 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar13) {
                local_160.field_2._M_allocated_capacity = *psVar13;
                local_160.field_2._8_8_ = plVar10[3];
                local_160._M_dataplus._M_p = (pointer)paVar2;
              }
              else {
                local_160.field_2._M_allocated_capacity = *psVar13;
                local_160._M_dataplus._M_p = (pointer)*plVar10;
              }
              local_160._M_string_length = plVar10[1];
              *plVar10 = (long)psVar13;
              plVar10[1] = 0;
              *(undefined1 *)(plVar10 + 2) = 0;
              std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_160._M_dataplus._M_p);
              goto LAB_001bd421;
            }
            std::__cxx11::string::append((char *)code_ptr);
            goto LAB_001bd6a8;
          }
          std::__cxx11::string::substr((ulong)&local_120,(ulong)&local_140);
          plVar10 = (long *)std::__cxx11::string::replace((ulong)&local_120,0,(char *)0x0,0x364533);
          local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
          puVar14 = (ulong *)(plVar10 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar14) {
            local_180.field_2._M_allocated_capacity = *puVar14;
            local_180.field_2._8_8_ = plVar10[3];
          }
          else {
            local_180.field_2._M_allocated_capacity = *puVar14;
            local_180._M_dataplus._M_p = (pointer)*plVar10;
          }
          local_180._M_string_length = plVar10[1];
          *plVar10 = (long)puVar14;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          NumToString<unsigned_short>(&local_e0,(pFVar6->value).type.fixed_length);
          uVar17 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_180._M_dataplus._M_p != &local_180.field_2) {
            uVar17 = local_180.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar17 < local_e0._M_string_length + local_180._M_string_length) {
            uVar17 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
              uVar17 = local_e0.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar17 < local_e0._M_string_length + local_180._M_string_length)
            goto LAB_001bd545;
            puVar11 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&local_e0,0,(char *)0x0,(ulong)local_180._M_dataplus._M_p);
          }
          else {
LAB_001bd545:
            puVar11 = (undefined8 *)
                      std::__cxx11::string::_M_append
                                ((char *)&local_180,(ulong)local_e0._M_dataplus._M_p);
          }
          local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
          psVar13 = puVar11 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar13) {
            local_1a0.field_2._M_allocated_capacity = *psVar13;
            local_1a0.field_2._8_8_ = puVar11[3];
          }
          else {
            local_1a0.field_2._M_allocated_capacity = *psVar13;
            local_1a0._M_dataplus._M_p = (pointer)*puVar11;
          }
          local_1a0._M_string_length = puVar11[1];
          *puVar11 = psVar13;
          puVar11[1] = 0;
          *(undefined1 *)psVar13 = 0;
          plVar10 = (long *)std::__cxx11::string::append((char *)&local_1a0);
          psVar13 = (size_type *)(plVar10 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar13) {
            local_160.field_2._M_allocated_capacity = *psVar13;
            local_160.field_2._8_8_ = plVar10[3];
            local_160._M_dataplus._M_p = (pointer)paVar2;
          }
          else {
            local_160.field_2._M_allocated_capacity = *psVar13;
            local_160._M_dataplus._M_p = (pointer)*plVar10;
          }
          local_160._M_string_length = plVar10[1];
          *plVar10 = (long)psVar13;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_160._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_160._M_dataplus._M_p != paVar2) {
            operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
            operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
            operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_180._M_dataplus._M_p != &local_180.field_2) {
            operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
          }
          uVar17 = local_120.field_2._M_allocated_capacity;
          _Var18._M_p = local_120._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_120._M_dataplus._M_p != &local_120.field_2) goto LAB_001bd6a0;
        }
LAB_001bd6a8:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_140._M_dataplus._M_p != &local_140.field_2) {
          operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._M_dataplus._M_p != &local_100.field_2) {
          operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
        }
        ppFVar12 = (struct_def->fields).vec.
                   super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
      }
      ppFVar16 = ppFVar16 + 1;
    } while (ppFVar16 != ppFVar12);
  }
  std::__cxx11::string::append((char *)code_ptr);
  paVar2 = &local_100.field_2;
  if ((local_98->cs_gen_json_serializer == true) &&
     (((local_c0->super_BaseGenerator).parser_)->root_struct_def_ == struct_def)) {
    std::__cxx11::string::append((char *)code_ptr);
    std::operator+(&local_140,"  public static ",&local_b8);
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_140);
    psVar13 = (size_type *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar13) {
      local_100.field_2._M_allocated_capacity = *psVar13;
      local_100.field_2._8_8_ = plVar10[3];
      local_100._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_100.field_2._M_allocated_capacity = *psVar13;
      local_100._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_100._M_string_length = plVar10[1];
    *plVar10 = (long)psVar13;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_100._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != paVar2) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
    std::operator+(&local_140,"    return Newtonsoft.Json.JsonConvert.DeserializeObject<",&local_b8)
    ;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_140);
    psVar13 = (size_type *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar13) {
      local_100.field_2._M_allocated_capacity = *psVar13;
      local_100.field_2._8_8_ = plVar10[3];
      local_100._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_100.field_2._M_allocated_capacity = *psVar13;
      local_100._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_100._M_string_length = plVar10[1];
    *plVar10 = (long)psVar13;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_100._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != paVar2) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)code_ptr);
    std::__cxx11::string::append((char *)code_ptr);
    std::__cxx11::string::append((char *)code_ptr);
    std::__cxx11::string::append((char *)code_ptr);
  }
  if (((local_c0->super_BaseGenerator).parser_)->root_struct_def_ == struct_def) {
    std::operator+(&local_140,"  public static ",&local_b8);
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_140);
    psVar13 = (size_type *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar13) {
      local_100.field_2._M_allocated_capacity = *psVar13;
      local_100.field_2._8_8_ = plVar10[3];
      local_100._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_100.field_2._M_allocated_capacity = *psVar13;
      local_100._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_100._M_string_length = plVar10[1];
    *plVar10 = (long)psVar13;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_100._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != paVar2) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
    std::operator+(&local_1a0,"    return ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)struct_def);
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_1a0);
    paVar3 = &local_160.field_2;
    psVar13 = (size_type *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar13) {
      local_160.field_2._M_allocated_capacity = *psVar13;
      local_160.field_2._8_8_ = plVar10[3];
      local_160._M_dataplus._M_p = (pointer)paVar3;
    }
    else {
      local_160.field_2._M_allocated_capacity = *psVar13;
      local_160._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_160._M_string_length = plVar10[1];
    *plVar10 = (long)psVar13;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::_M_append
                                ((char *)&local_160,
                                 (ulong)(struct_def->super_Definition).name._M_dataplus._M_p);
    local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
    psVar13 = (size_type *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar13) {
      local_140.field_2._M_allocated_capacity = *psVar13;
      local_140.field_2._8_8_ = plVar10[3];
    }
    else {
      local_140.field_2._M_allocated_capacity = *psVar13;
      local_140._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_140._M_string_length = plVar10[1];
    *plVar10 = (long)psVar13;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_140);
    psVar13 = (size_type *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar13) {
      local_100.field_2._M_allocated_capacity = *psVar13;
      local_100.field_2._8_8_ = plVar10[3];
      local_100._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_100.field_2._M_allocated_capacity = *psVar13;
      local_100._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_100._M_string_length = plVar10[1];
    *plVar10 = (long)psVar13;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_100._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != paVar2) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != paVar3) {
      operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
    }
    paVar4 = &local_1a0.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_dataplus._M_p != paVar4) {
      operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)code_ptr);
    std::__cxx11::string::append((char *)code_ptr);
    std::__cxx11::string::append((char *)code_ptr);
    std::operator+(&local_120,"    ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)struct_def);
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_120);
    puVar14 = (ulong *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar14) {
      local_180.field_2._M_allocated_capacity = *puVar14;
      local_180.field_2._8_8_ = plVar10[3];
      local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
    }
    else {
      local_180.field_2._M_allocated_capacity = *puVar14;
      local_180._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_180._M_string_length = plVar10[1];
    *plVar10 = (long)puVar14;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append
                        ((char *)&local_180,
                         (ulong)(struct_def->super_Definition).name._M_dataplus._M_p);
    psVar13 = puVar11 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar13) {
      local_1a0.field_2._M_allocated_capacity = *psVar13;
      local_1a0.field_2._8_8_ = puVar11[3];
      local_1a0._M_dataplus._M_p = (pointer)paVar4;
    }
    else {
      local_1a0.field_2._M_allocated_capacity = *psVar13;
      local_1a0._M_dataplus._M_p = (pointer)*puVar11;
    }
    local_1a0._M_string_length = puVar11[1];
    *puVar11 = psVar13;
    puVar11[1] = 0;
    *(undefined1 *)(puVar11 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_1a0);
    psVar13 = (size_type *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar13) {
      local_160.field_2._M_allocated_capacity = *psVar13;
      local_160.field_2._8_8_ = plVar10[3];
      local_160._M_dataplus._M_p = (pointer)paVar3;
    }
    else {
      local_160.field_2._M_allocated_capacity = *psVar13;
      local_160._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_160._M_string_length = plVar10[1];
    *plVar10 = (long)psVar13;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::_M_append
                                ((char *)&local_160,
                                 (ulong)(struct_def->super_Definition).name._M_dataplus._M_p);
    psVar13 = (size_type *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar13) {
      local_140.field_2._M_allocated_capacity = *psVar13;
      local_140.field_2._8_8_ = plVar10[3];
      local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
    }
    else {
      local_140.field_2._M_allocated_capacity = *psVar13;
      local_140._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_140._M_string_length = plVar10[1];
    *plVar10 = (long)psVar13;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_140);
    psVar13 = (size_type *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar13) {
      local_100.field_2._M_allocated_capacity = *psVar13;
      local_100.field_2._8_8_ = plVar10[3];
      local_100._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_100.field_2._M_allocated_capacity = *psVar13;
      local_100._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_100._M_string_length = plVar10[1];
    *plVar10 = (long)psVar13;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_100._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != paVar2) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != paVar3) {
      operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_dataplus._M_p != paVar4) {
      operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180._M_dataplus._M_p != &local_180.field_2) {
      operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)code_ptr);
    std::__cxx11::string::append((char *)code_ptr);
  }
  std::__cxx11::string::append((char *)code_ptr);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void GenStruct_ObjectAPI(StructDef &struct_def, std::string *code_ptr,
                           const IDLOptions &opts) const {
    auto &code = *code_ptr;
    if (struct_def.attributes.Lookup("private")) {
      code += "internal ";
    } else {
      code += "public ";
    }
    if (struct_def.attributes.Lookup("csharp_partial")) {
      // generate a partial class for this C# struct/table
      code += "partial ";
    }
    auto class_name = GenTypeName_ObjectAPI(struct_def.name, opts);
    code += "class " + class_name;
    code += "\n{\n";
    // Generate Properties
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      auto &field = **it;
      if (field.deprecated) continue;
      if (field.value.type.base_type == BASE_TYPE_UTYPE) continue;
      if (field.value.type.element == BASE_TYPE_UTYPE) continue;
      auto type_name = GenTypeGet_ObjectAPI(field.value.type, opts);
      if (field.IsScalarOptional()) type_name += "?";
      auto camel_name = Name(field);
      if (camel_name == struct_def.name) { camel_name += "_"; }
      if (opts.cs_gen_json_serializer) {
        if (IsUnion(field.value.type)) {
          auto utype_name = NamespacedName(*field.value.type.enum_def);
          code +=
              "  [Newtonsoft.Json.JsonProperty(\"" + field.name + "_type\")]\n";
          if (IsVector(field.value.type)) {
            code += "  private " + utype_name + "[] " + camel_name + "Type {\n";
            code += "    get {\n";
            code += "      if (this." + camel_name + " == null) return null;\n";
            code += "      var _o = new " + utype_name + "[this." + camel_name +
                    ".Count];\n";
            code +=
                "      for (var _j = 0; _j < _o.Length; ++_j) { _o[_j] = "
                "this." +
                camel_name + "[_j].Type; }\n";
            code += "      return _o;\n";
            code += "    }\n";
            code += "    set {\n";
            code += "      this." + camel_name + " = new List<" + utype_name +
                    "Union>();\n";
            code += "      for (var _j = 0; _j < value.Length; ++_j) {\n";
            code += "        var _o = new " + utype_name + "Union();\n";
            code += "        _o.Type = value[_j];\n";
            code += "        this." + camel_name + ".Add(_o);\n";
            code += "      }\n";
            code += "    }\n";
            code += "  }\n";
          } else {
            code += "  private " + utype_name + " " + camel_name + "Type {\n";
            code += "    get {\n";
            code += "      return this." + camel_name + " != null ? this." +
                    camel_name + ".Type : " + utype_name + ".NONE;\n";
            code += "    }\n";
            code += "    set {\n";
            code += "      this." + camel_name + " = new " + utype_name +
                    "Union();\n";
            code += "      this." + camel_name + ".Type = value;\n";
            code += "    }\n";
            code += "  }\n";
          }
        }
        code += "  [Newtonsoft.Json.JsonProperty(\"" + field.name + "\")]\n";
        if (IsUnion(field.value.type)) {
          auto union_name =
              (IsVector(field.value.type))
                  ? GenTypeGet_ObjectAPI(field.value.type.VectorType(), opts)
                  : type_name;
          code += "  [Newtonsoft.Json.JsonConverter(typeof(" + union_name +
                  "_JsonConverter))]\n";
        }
        if (field.attributes.Lookup("hash")) {
          code += "  [Newtonsoft.Json.JsonIgnore()]\n";
        }
      }
      code += "  public " + type_name + " " + camel_name + " { get; set; }\n";
    }
    // Generate Constructor
    code += "\n";
    code += "  public " + class_name + "() {\n";
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      auto &field = **it;
      if (field.deprecated) continue;
      if (field.value.type.base_type == BASE_TYPE_UTYPE) continue;
      if (field.value.type.element == BASE_TYPE_UTYPE) continue;
      auto camel_name = Name(field);
      if (camel_name == struct_def.name) { camel_name += "_"; }
      code += "    this." + camel_name + " = ";
      auto type_name = GenTypeGet_ObjectAPI(field.value.type, opts);
      if (IsScalar(field.value.type.base_type)) {
        code += GenDefaultValue(field) + ";\n";
      } else {
        switch (field.value.type.base_type) {
          case BASE_TYPE_STRUCT: {
            if (IsStruct(field.value.type)) {
              code += "new " + type_name + "();\n";
            } else {
              code += "null;\n";
            }
            break;
          }
          case BASE_TYPE_ARRAY: {
            code += "new " + type_name.substr(0, type_name.length() - 1) +
                    NumToString(field.value.type.fixed_length) + "];\n";
            break;
          }
          default: {
            code += "null;\n";
            break;
          }
        }
      }
    }
    code += "  }\n";
    // Generate Serialization
    if (opts.cs_gen_json_serializer &&
        parser_.root_struct_def_ == &struct_def) {
      code += "\n";
      code += "  public static " + class_name +
              " DeserializeFromJson(string jsonText) {\n";
      code += "    return Newtonsoft.Json.JsonConvert.DeserializeObject<" +
              class_name + ">(jsonText);\n";
      code += "  }\n";
      code += "  public string SerializeToJson() {\n";
      code +=
          "    return Newtonsoft.Json.JsonConvert.SerializeObject(this, "
          "Newtonsoft.Json.Formatting.Indented);\n";
      code += "  }\n";
    }
    if (parser_.root_struct_def_ == &struct_def) {
      code += "  public static " + class_name +
              " DeserializeFromBinary(byte[] fbBuffer) {\n";
      code += "    return " + struct_def.name + ".GetRootAs" + struct_def.name +
              "(new ByteBuffer(fbBuffer)).UnPack();\n";
      code += "  }\n";
      code += "  public byte[] SerializeToBinary() {\n";
      code += "    var fbb = new FlatBufferBuilder(0x10000);\n";
      code += "    " + struct_def.name + ".Finish" + struct_def.name +
              "Buffer(fbb, " + struct_def.name + ".Pack(fbb, this));\n";
      code += "    return fbb.DataBuffer.ToSizedArray();\n";
      code += "  }\n";
    }
    code += "}\n\n";
  }